

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O2

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::draw_sms
          (Base<(TI::TMS::Personality)3> *this,int start,int end,uint32_t cram_dot)

{
  long lVar1;
  uint32_t uVar2;
  iterator pvVar3;
  uint32_t *puVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  int c;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  int colour_buffer [256];
  
  pvVar3 = this->draw_line_buffer_;
  lVar13 = (long)start;
  if ((0xf < (this->output_pointer_).row) ||
     (uVar19 = (ulong)(uint)start, uVar5 = start, uVar14 = end,
     (this->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_lock_ == false)) {
    uVar7 = pvVar3->latched_horizontal_scroll & 7;
    bVar9 = this->background_colour_;
    for (lVar11 = lVar13; lVar11 < (long)(ulong)uVar7; lVar11 = lVar11 + 1) {
      colour_buffer[lVar11] = bVar9 + 0x10;
    }
    uVar5 = start - uVar7;
    uVar19 = (ulong)uVar7;
    if (uVar5 != 0 && (int)uVar7 <= start) {
      uVar19 = (ulong)(uint)start;
    }
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    uVar14 = end - uVar7;
    if ((int)(end - uVar7) < 1) {
      uVar14 = 0;
    }
  }
  if ((int)uVar5 < end) {
    iVar12 = uVar14 - uVar5;
    iVar8 = 8 - (uVar5 & 7);
    if (iVar12 <= iVar8) {
      iVar8 = iVar12;
    }
    lVar11 = (long)((int)uVar5 >> 3);
    uVar14 = *(uint *)((long)&pvVar3->field_5 + lVar11 * 4 + 0x20);
    bVar9 = (pvVar3->field_5).bitmap[lVar11];
    sVar6 = (sbyte)(uVar5 & 7);
    uVar5 = uVar14 << sVar6;
    if ((bVar9 & 2) != 0) {
      uVar5 = uVar14 >> sVar6;
    }
    while( true ) {
      uVar18 = (ulong)(uVar5 >> 8);
      uVar15 = (ulong)(uVar5 >> 0x10);
      uVar16 = (ulong)(uVar5 >> 0x18);
      uVar14 = (uint)bVar9 + (uint)bVar9 & 0x30;
      uVar19 = (ulong)(int)uVar19;
      if ((bVar9 & 2) == 0) {
        iVar10 = 0;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        while (bVar20 = iVar10 != 0, iVar10 = iVar10 + -1, bVar20) {
          colour_buffer[uVar19] =
               (uVar5 & 0xff) >> 7 |
               (uint)(uVar18 >> 6) & 2 | (uint)(uVar15 >> 5) & 4 | (uint)(uVar16 >> 4) & 8 | uVar14;
          uVar19 = uVar19 + 1;
          uVar5 = (((uint)uVar18 & 0xff) << 8 | ((uint)uVar15 & 0xff) << 0x10 | (int)uVar16 << 0x18
                  | uVar5 & 0xff) * 2;
          uVar18 = (ulong)(uVar5 >> 8);
          uVar15 = (ulong)(uVar5 >> 0x10);
          uVar16 = (ulong)(uVar5 >> 0x18);
        }
      }
      else {
        iVar10 = 0;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        while (bVar20 = iVar10 != 0, iVar10 = iVar10 + -1, bVar20) {
          colour_buffer[uVar19] =
               ((uint)uVar16 & 1) * 8 + ((uint)uVar15 & 1) * 4 + ((uint)uVar18 & 1) * 2 | uVar5 & 1
               | uVar14;
          uVar19 = uVar19 + 1;
          uVar7 = ((uint)uVar15 & 0xff) << 0x10 | (uint)uVar16 << 0x18;
          uVar17 = ((uint)uVar18 & 0xff) << 8 | uVar7;
          uVar5 = (uVar5 & 0xfe | uVar17) >> 1;
          uVar18 = (ulong)(uVar17 >> 9);
          uVar15 = (ulong)(uVar7 >> 0x11);
          uVar16 = uVar16 >> 1;
        }
      }
      iVar12 = iVar12 - iVar8;
      if (iVar12 == 0) break;
      iVar8 = 8;
      if (iVar12 < 8) {
        iVar8 = iVar12;
      }
      lVar1 = lVar11 * 4;
      bVar9 = (pvVar3->field_5).bitmap[lVar11 + 1];
      lVar11 = lVar11 + 1;
      uVar5 = *(uint *)((long)&pvVar3->field_5 + lVar1 + 0x24);
    }
  }
  draw_sprites<(TI::TMS::SpriteMode)2,false>(this,'\0',start,end,&default_palette,colour_buffer);
  puVar4 = this->pixel_target_;
  puVar4[lVar13] =
       cram_dot |
       (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
       [colour_buffer[lVar13] & 0x1f];
  while (lVar13 = lVar13 + 1, lVar13 < end) {
    puVar4[lVar13] =
         (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
         [colour_buffer[lVar13] & 0x1f];
  }
  if ((end == 0x100) &&
     ((this->super_Storage<(TI::TMS::Personality)3,_void>).hide_left_column_ == true)) {
    puVar4 = this->pixel_origin_;
    uVar2 = (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
            [(ulong)this->background_colour_ + 0x10];
    puVar4[4] = uVar2;
    puVar4[5] = uVar2;
    puVar4[6] = uVar2;
    puVar4[7] = uVar2;
    *puVar4 = uVar2;
    puVar4[1] = uVar2;
    puVar4[2] = uVar2;
    puVar4[3] = uVar2;
  }
  return;
}

Assistant:

void Base<personality>::draw_sms([[maybe_unused]] int start, [[maybe_unused]] int end, [[maybe_unused]] uint32_t cram_dot) {
	if constexpr (is_sega_vdp(personality)) {
		int colour_buffer[256];
		auto &line_buffer = *draw_line_buffer_;

		/*
			Add extra border for any pixels that fall before the fine scroll.
		*/
		int tile_start = start, tile_end = end;
		int tile_offset = start;
		if(output_pointer_.row >= 16 || !Storage<personality>::horizontal_scroll_lock_) {
			for(int c = start; c < (line_buffer.latched_horizontal_scroll & 7); ++c) {
				colour_buffer[c] = 16 + background_colour_;
				++tile_offset;
			}

			// Remove the border area from that to which tiles will be drawn.
			tile_start = std::max(start - (line_buffer.latched_horizontal_scroll & 7), 0);
			tile_end = std::max(end - (line_buffer.latched_horizontal_scroll & 7), 0);
		}


		uint32_t pattern;
		uint8_t *const pattern_index = reinterpret_cast<uint8_t *>(&pattern);

		/*
			Add background tiles; these will fill the colour_buffer with values in which
			the low five bits are a palette index, and bit six is set if this tile has
			priority over sprites.
		*/
		if(tile_start < end) {
			const int shift = tile_start & 7;
			int byte_column = tile_start >> 3;
			int pixels_left = tile_end - tile_start;
			int length = std::min(pixels_left, 8 - shift);

			pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			if(line_buffer.tiles.flags[byte_column]&2)
				pattern >>= shift;
			else
				pattern <<= shift;

			while(true) {
				const int palette_offset = (line_buffer.tiles.flags[byte_column]&0x18) << 1;
				if(line_buffer.tiles.flags[byte_column]&2) {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x01) << 3) |
							((pattern_index[2] & 0x01) << 2) |
							((pattern_index[1] & 0x01) << 1) |
							((pattern_index[0] & 0x01) << 0) |
							palette_offset;
						++tile_offset;
						pattern >>= 1;
					}
				} else {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x80) >> 4) |
							((pattern_index[2] & 0x80) >> 5) |
							((pattern_index[1] & 0x80) >> 6) |
							((pattern_index[0] & 0x80) >> 7) |
							palette_offset;
						++tile_offset;
						pattern <<= 1;
					}
				}

				pixels_left -= length;
				if(!pixels_left) break;

				length = std::min(8, pixels_left);
				byte_column++;
				pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			}
		}

		/*
			Apply sprites (if any).
		*/
		draw_sprites<SpriteMode::MasterSystem, false>(0, start, end, palette(), colour_buffer);	// TODO provide good y, as per elsewhere.

		// Map from the 32-colour buffer to real output pixels, applying the specific CRAM dot if any.
		pixel_target_[start] = Storage<personality>::colour_ram_[colour_buffer[start] & 0x1f] | cram_dot;
		for(int c = start+1; c < end; ++c) {
			pixel_target_[c] = Storage<personality>::colour_ram_[colour_buffer[c] & 0x1f];
		}

		// If the VDP is set to hide the left column and this is the final call that'll come
		// this line, hide it.
		if(end == 256) {
			if(Storage<personality>::hide_left_column_) {
				pixel_origin_[0] = pixel_origin_[1] = pixel_origin_[2] = pixel_origin_[3] =
				pixel_origin_[4] = pixel_origin_[5] = pixel_origin_[6] = pixel_origin_[7] =
					Storage<personality>::colour_ram_[16 + background_colour_];
			}
		}
	}
}